

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_clz_i32_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_clz_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_clz_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_clz_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_clz_i32, ret, arg1, arg2);
    } else if (TCG_TARGET_HAS_clz_i64) {
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, t1, arg1);
        tcg_gen_extu_i32_i64(tcg_ctx, t2, arg2);
        tcg_gen_addi_i64(tcg_ctx, t2, t2, 32);
        tcg_gen_clz_i64(tcg_ctx, t1, t1, t2);
        tcg_gen_extrl_i64_i32(tcg_ctx, ret, t1);
        tcg_temp_free_i64(tcg_ctx, t1);
        tcg_temp_free_i64(tcg_ctx, t2);
        tcg_gen_subi_i32(tcg_ctx, ret, ret, 32);
    } else {
        gen_helper_clz_i32(tcg_ctx, ret, arg1, arg2);
    }
}